

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_iterators.h
# Opt level: O2

void __thiscall
st_tree::detail::
b1st_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>
::b1st_iterator(b1st_iterator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>
                *this,value_type *root)

{
  value_type *local_18;
  
  this->_vptr_b1st_iterator = (_func_int **)&PTR__b1st_iterator_002cd8d8;
  std::
  _Deque_base<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
  ::_Deque_base(&(this->_queue).
                 super__Deque_base<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<st_tree::detail::node_keyed<st_tree::tree<int,_st_tree::keyed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<int>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
               );
  if (root != (value_type *)0x0) {
    local_18 = root;
    std::
    deque<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>*,std::allocator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>*>>
    ::
    emplace_back<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>*>
              ((deque<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>*,std::allocator<st_tree::detail::node_keyed<st_tree::tree<int,st_tree::keyed<std::__cxx11::string,std::less<std::__cxx11::string>>,std::allocator<int>>,int,std::__cxx11::string,std::less<std::__cxx11::string>>*>>
                *)&this->_queue,&local_18);
  }
  return;
}

Assistant:

b1st_iterator(value_type* root) {
        if (root == NULL) return;
        _queue.push_back(const_cast<node_type*>(root));
    }